

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

int __thiscall fmt::File::dup2(File *this,int __fd,int __fd2)

{
  int *piVar1;
  undefined7 uVar3;
  undefined8 uVar2;
  int result;
  int *in_stack_00000040;
  int *in_stack_00000048;
  int in_stack_00000054;
  SystemError *in_stack_00000058;
  CStringRef in_stack_00000060;
  bool local_31;
  BasicCStringRef<char> local_18;
  int local_10;
  int local_c;
  File *local_8;
  
  local_10 = 0;
  local_c = __fd;
  local_8 = this;
  do {
    local_10 = ::dup2(this->fd_,local_c);
    uVar3 = 0;
    local_31 = false;
    if (local_10 == -1) {
      piVar1 = __errno_location();
      local_31 = *piVar1 == 4;
      uVar3 = (undefined7)((ulong)piVar1 >> 8);
    }
  } while (local_31 != false);
  if (local_10 == -1) {
    uVar2 = __cxa_allocate_exception(0x18);
    __errno_location();
    BasicCStringRef<char>::BasicCStringRef(&local_18,"cannot duplicate file descriptor {} to {}");
    SystemError::SystemError<int,int>
              (in_stack_00000058,in_stack_00000054,in_stack_00000060,in_stack_00000048,
               in_stack_00000040);
    __cxa_throw(uVar2,&SystemError::typeinfo,SystemError::~SystemError);
  }
  return (int)CONCAT71(uVar3,local_31);
}

Assistant:

void fmt::File::dup2(int fd) {
  int result = 0;
  FMT_RETRY(result, FMT_POSIX_CALL(dup2(fd_, fd)));
  if (result == -1) {
    FMT_THROW(SystemError(errno,
      "cannot duplicate file descriptor {} to {}", fd_, fd));
  }
}